

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_int_resize(ImVector_int *self,int new_size)

{
  int new_size_local;
  ImVector_int *self_local;
  
  ImVector<int>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_int_resize(ImVector_int* self,int new_size)
{
    return self->resize(new_size);
}